

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve_address.cc
# Opt level: O1

raptor_error
raptor_blocking_resolve_address(char *name,char *default_port,raptor_resolved_addresses **addresses)

{
  _Head_base<0UL,_char_*,_false> _Var1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  long *plVar5;
  void *pvVar6;
  long *in_RCX;
  addrinfo *paVar7;
  long lVar8;
  bool bVar9;
  StringView name_00;
  UniquePtr<char> port;
  UniquePtr<char> host;
  addrinfo *result;
  RefCountedPtr<raptor::Status> local_80;
  _Head_base<0UL,_char_*,_false> local_78;
  _Head_base<0UL,_char_*,_false> local_70;
  addrinfo *local_68;
  char *local_60;
  addrinfo local_58;
  
  sVar3 = 0;
  local_68 = (addrinfo *)0x0;
  name[0] = '\0';
  name[1] = '\0';
  name[2] = '\0';
  name[3] = '\0';
  name[4] = '\0';
  name[5] = '\0';
  name[6] = '\0';
  name[7] = '\0';
  local_70._M_head_impl = (char *)0x0;
  local_78._M_head_impl = (char *)0x0;
  local_60 = default_port;
  if (default_port != (char *)0x0) {
    sVar3 = strlen(default_port);
  }
  name_00._size = sVar3;
  name_00._ptr = default_port;
  raptor::SplitHostPort(name_00,(UniquePtr<char> *)&local_70,(UniquePtr<char> *)&local_78);
  if (local_70._M_head_impl == (char *)0x0) {
    raptor::MakeStatusFromFormat<char_const(&)[27],char_const*&>
              ((raptor *)&local_80,(char (*) [27])"unparseable host:port (%s)",&local_60);
    if (*(RefCounted<raptor::Status,_raptor::NonPolymorphicRefCount> **)name !=
        (RefCounted<raptor::Status,_raptor::NonPolymorphicRefCount> *)0x0) {
      raptor::RefCounted<raptor::Status,_raptor::NonPolymorphicRefCount>::Unref
                (*(RefCounted<raptor::Status,_raptor::NonPolymorphicRefCount> **)name);
    }
  }
  else {
    if (local_78._M_head_impl == (char *)0x0) {
      if (addresses == (raptor_resolved_addresses **)0x0) {
        raptor::MakeStatusFromFormat<char_const(&)[21],char_const*&>
                  ((raptor *)&local_80,(char (*) [21])"no port in name (%s)",&local_60);
        if (*(RefCounted<raptor::Status,_raptor::NonPolymorphicRefCount> **)name !=
            (RefCounted<raptor::Status,_raptor::NonPolymorphicRefCount> *)0x0) {
          raptor::RefCounted<raptor::Status,_raptor::NonPolymorphicRefCount>::Unref
                    (*(RefCounted<raptor::Status,_raptor::NonPolymorphicRefCount> **)name);
        }
        goto LAB_0010cef6;
      }
      pcVar4 = raptor_strdup((char *)addresses);
      _Var1._M_head_impl = local_78._M_head_impl;
      bVar9 = local_78._M_head_impl != (char *)0x0;
      local_78._M_head_impl = pcVar4;
      if (bVar9) {
        raptor::Free(_Var1._M_head_impl);
      }
    }
    local_58.ai_canonname = (char *)0x0;
    local_58.ai_next = (addrinfo *)0x0;
    local_58.ai_addrlen = 0;
    local_58._20_4_ = 0;
    local_58.ai_addr = (sockaddr *)0x0;
    local_58.ai_socktype = 1;
    local_58.ai_protocol = 0;
    local_58.ai_flags = 1;
    local_58.ai_family = 0;
    iVar2 = getaddrinfo(local_70._M_head_impl,local_78._M_head_impl,&local_58,&local_68);
    _Var1._M_head_impl = local_78._M_head_impl;
    if (iVar2 == 0) {
LAB_0010ce18:
      plVar5 = (long *)raptor::Malloc(0x10);
      *in_RCX = (long)plVar5;
      *plVar5 = 0;
      if (local_68 != (addrinfo *)0x0) {
        lVar8 = *plVar5;
        paVar7 = local_68;
        do {
          lVar8 = lVar8 + 1;
          paVar7 = paVar7->ai_next;
        } while (paVar7 != (addrinfo *)0x0);
        *plVar5 = lVar8;
      }
      pvVar6 = raptor::Malloc(*plVar5 * 0x84);
      *(void **)(*in_RCX + 8) = pvVar6;
      if (local_68 != (addrinfo *)0x0) {
        lVar8 = 0;
        paVar7 = local_68;
        do {
          memcpy((void *)(*(long *)(*in_RCX + 8) + lVar8),paVar7->ai_addr,(ulong)paVar7->ai_addrlen)
          ;
          *(socklen_t *)(*(long *)(*in_RCX + 8) + 0x80 + lVar8) = paVar7->ai_addrlen;
          paVar7 = paVar7->ai_next;
          lVar8 = lVar8 + 0x84;
        } while (paVar7 != (addrinfo *)0x0);
      }
      local_80._value = (Status *)0x0;
      if (*(RefCounted<raptor::Status,_raptor::NonPolymorphicRefCount> **)name !=
          (RefCounted<raptor::Status,_raptor::NonPolymorphicRefCount> *)0x0) {
        raptor::RefCounted<raptor::Status,_raptor::NonPolymorphicRefCount>::Unref
                  (*(RefCounted<raptor::Status,_raptor::NonPolymorphicRefCount> **)name);
      }
      name[0] = '\0';
      name[1] = '\0';
      name[2] = '\0';
      name[3] = '\0';
      name[4] = '\0';
      name[5] = '\0';
      name[6] = '\0';
      name[7] = '\0';
      goto LAB_0010cf05;
    }
    lVar8 = 0;
    do {
      iVar2 = strcmp(_Var1._M_head_impl,*(char **)((long)&PTR_anon_var_dwarf_357e5_00118770 + lVar8)
                    );
      if (iVar2 == 0) {
        iVar2 = getaddrinfo(local_70._M_head_impl,
                            *(char **)((long)&PTR_anon_var_dwarf_357fb_00118778 + lVar8),&local_58,
                            &local_68);
        if (iVar2 == 0) goto LAB_0010ce18;
        break;
      }
      lVar8 = lVar8 + 0x10;
    } while (lVar8 == 0x10);
    raptor::MakeStatusFromPosixError((raptor *)&local_80,"getaddrinfo");
    if (*(RefCounted<raptor::Status,_raptor::NonPolymorphicRefCount> **)name !=
        (RefCounted<raptor::Status,_raptor::NonPolymorphicRefCount> *)0x0) {
      raptor::RefCounted<raptor::Status,_raptor::NonPolymorphicRefCount>::Unref
                (*(RefCounted<raptor::Status,_raptor::NonPolymorphicRefCount> **)name);
    }
  }
LAB_0010cef6:
  *(Status **)name = local_80._value;
LAB_0010cf05:
  local_80._value = (Status *)0x0;
  raptor::RefCountedPtr<raptor::Status>::~RefCountedPtr(&local_80);
  if (local_68 != (addrinfo *)0x0) {
    freeaddrinfo(local_68);
  }
  std::unique_ptr<char,_raptor::DefaultDeleteChar>::~unique_ptr
            ((unique_ptr<char,_raptor::DefaultDeleteChar> *)&local_78);
  std::unique_ptr<char,_raptor::DefaultDeleteChar>::~unique_ptr
            ((unique_ptr<char,_raptor::DefaultDeleteChar> *)&local_70);
  return (raptor_error)(Status *)name;
}

Assistant:

raptor_error raptor_blocking_resolve_address(
                                const char* name,
                                const char* default_port,
                                raptor_resolved_addresses** addresses) {

    struct addrinfo hints;
    struct addrinfo *result = nullptr, *resp;
    int s;
    size_t i;
    raptor_error err = RAPTOR_ERROR_NONE;

    /* parse name, splitting it into host and port parts */
    raptor::UniquePtr<char> host;
    raptor::UniquePtr<char> port;
    raptor::SplitHostPort(name, &host, &port);

    if (host == nullptr) {
        err = RAPTOR_ERROR_FROM_FORMAT("unparseable host:port (%s)", name);
        goto done;
    }

    if (port == nullptr) {
        if (default_port == nullptr) {
            err = RAPTOR_ERROR_FROM_FORMAT("no port in name (%s)", name);
            goto done;
        }
        port.reset(raptor_strdup(default_port));
    }

    /* Call getaddrinfo */
    memset(&hints, 0, sizeof(hints));
    hints.ai_family = AF_UNSPEC;     /* ipv4 or ipv6 */
    hints.ai_socktype = SOCK_STREAM; /* stream socket */
    hints.ai_flags = AI_PASSIVE;     /* for wildcard IP address */

    s = getaddrinfo(host.get(), port.get(), &hints, &result);
    if (s != 0) {
        /* Retry if well-known service name is recognized */
        const char* svc[][2] = {{"http", "80"}, {"https", "443"}};
        for (i = 0; i < RAPTOR_ARRAY_SIZE(svc); i++) {
            if (strcmp(port.get(), svc[i][0]) == 0) {
                s = getaddrinfo(host.get(), svc[i][1], &hints, &result);
                break;
            }
        }
    }

    if (s != 0) {
        err = RAPTOR_POSIX_ERROR("getaddrinfo");
        goto done;
    }

    /* Success path: set addrs non-NULL, fill it in */
    *addresses = static_cast<raptor_resolved_addresses*>(
        raptor::Malloc(sizeof(raptor_resolved_addresses)));
    (*addresses)->naddrs = 0;
    for (resp = result; resp != nullptr; resp = resp->ai_next) {
        (*addresses)->naddrs++;
    }
    (*addresses)->addrs = static_cast<raptor_resolved_address*>(
        raptor::Malloc(sizeof(raptor_resolved_address) * (*addresses)->naddrs));

    i = 0;
    for (resp = result; resp != nullptr; resp = resp->ai_next) {
        memcpy(&(*addresses)->addrs[i].addr, resp->ai_addr, resp->ai_addrlen);
        (*addresses)->addrs[i].len = resp->ai_addrlen;
        i++;
    }
    err = RAPTOR_ERROR_NONE;
done:
    if (result) {
        freeaddrinfo(result);
    }
    return err;
}